

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

string * __thiscall
cmsys::SystemTools::GetCurrentDateTime_abi_cxx11_
          (string *__return_storage_ptr__,SystemTools *this,char *format)

{
  undefined8 __format;
  tm *__tp;
  allocator local_421;
  time_t local_420;
  time_t t;
  char buf [1024];
  char *format_local;
  
  buf._1016_8_ = this;
  time(&local_420);
  __format = buf._1016_8_;
  __tp = localtime(&local_420);
  strftime((char *)&t,0x400,(char *)__format,__tp);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,(char *)&t,&local_421);
  std::allocator<char>::~allocator((allocator<char> *)&local_421);
  return __return_storage_ptr__;
}

Assistant:

std::string SystemTools::GetCurrentDateTime(const char* format)
{
  char buf[1024];
  time_t t;
  time(&t);
  strftime(buf, sizeof(buf), format, localtime(&t));
  return std::string(buf);
}